

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void OutputCircularDependencies
               (Configuration *config,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
               *components,path *outfile)

{
  ostream *poVar1;
  char *pcVar2;
  string *psVar3;
  ofstream *poVar4;
  __node_base *p_Var5;
  _Hash_node_base *p_Var6;
  string local_278;
  string local_258;
  OstreamHolder outHolder;
  
  OstreamHolder::OstreamHolder(&outHolder,outfile);
  poVar4 = &outHolder.out;
  if (outHolder.isStdout != false) {
    poVar4 = (ofstream *)&std::cout;
  }
  poVar1 = std::operator<<((ostream *)poVar4,"digraph dependencies {");
  std::operator<<(poVar1,'\n');
  p_Var5 = &(components->_M_h)._M_before_begin;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    if (p_Var5[5]._M_nxt[0x27]._M_nxt != (_Hash_node_base *)0x0) {
      poVar1 = std::operator<<((ostream *)poVar4,"  ");
      Component::QuotedName_abi_cxx11_(&local_278,(Component *)p_Var5[5]._M_nxt);
      poVar1 = std::operator<<(poVar1,(string *)&local_278);
      poVar1 = std::operator<<(poVar1," [shape=");
      pcVar2 = getShapeForSize((Component *)p_Var5[5]._M_nxt);
      poVar1 = std::operator<<(poVar1,pcVar2);
      std::operator<<(poVar1,"];\n");
      std::__cxx11::string::~string((string *)&local_278);
      p_Var6 = p_Var5[5]._M_nxt + 0x26;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
        poVar1 = std::operator<<((ostream *)poVar4,"  ");
        Component::QuotedName_abi_cxx11_(&local_278,(Component *)p_Var5[5]._M_nxt);
        poVar1 = std::operator<<(poVar1,(string *)&local_278);
        poVar1 = std::operator<<(poVar1," -> ");
        Component::QuotedName_abi_cxx11_(&local_258,(Component *)p_Var6[1]._M_nxt);
        poVar1 = std::operator<<(poVar1,(string *)&local_258);
        poVar1 = std::operator<<(poVar1," [color=");
        psVar3 = getLinkColor_abi_cxx11_
                           (config,(Component *)p_Var5[5]._M_nxt,(Component *)p_Var6[1]._M_nxt);
        poVar1 = std::operator<<(poVar1,(string *)psVar3);
        poVar1 = std::operator<<(poVar1,"];");
        std::operator<<(poVar1,'\n');
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::string::~string((string *)&local_278);
      }
    }
  }
  poVar1 = std::operator<<((ostream *)poVar4,"}");
  std::operator<<(poVar1,'\n');
  boost::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream(&outHolder.out);
  return;
}

Assistant:

void OutputCircularDependencies(const Configuration& config, std::unordered_map<std::string, Component *> &components,
                                const filesystem::path &outfile) {
    OstreamHolder outHolder(outfile);
    std::ostream& out = outHolder.get();
    out << "digraph dependencies {" << '\n';
    for (const auto &c : components) {
        if (c.second->circulars.empty()) {
            continue;
        }

        out << "  " << c.second->QuotedName() << " [shape=" << getShapeForSize(c.second) << "];\n";

        for (const auto &t : c.second->circulars) {
            out << "  " << c.second->QuotedName() << " -> " << t->QuotedName() << " [color="
                << getLinkColor(config, c.second, t) << "];" << '\n';
        }
    }
    out << "}" << '\n';
}